

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTxyz.cpp
# Opt level: O0

RealType __thiscall OpenMD::NPTxyz::calcConservedQuantity(NPTxyz *this)

{
  int iVar1;
  SquareMatrix3<double> *in_RDI;
  RealType RVar2;
  double dVar3;
  SquareMatrix<double,_3> tmp;
  RealType trEta;
  RealType barostat_potential;
  RealType barostat_kinetic;
  RealType thermostat_potential;
  RealType thermostat_kinetic;
  RealType totalEnergy;
  RealType conservedQuantity;
  SquareMatrix<double,_3> *in_stack_fffffffffffffe88;
  SimInfo *in_stack_fffffffffffffe90;
  Thermo *this_00;
  Thermo *in_stack_fffffffffffffea0;
  SquareMatrix3<double> *this_01;
  SquareMatrix3<double> local_128 [2];
  SquareMatrix<double,_3> local_98;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  RealType local_28;
  double local_20;
  pair<double,_double> local_18;
  
  local_18 = Snapshot::getThermostat
                       ((Snapshot *)
                        in_RDI[3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][1]);
  std::pair<double,_double>::operator=
            ((pair<double,_double> *)
             (in_RDI[5].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2] + 1)
             ,&local_18);
  (**(code **)((long)(in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     [0][0] + 0xc0))();
  iVar1 = SimInfo::getNGlobalIntegrableObjects
                    ((SimInfo *)
                     in_RDI[1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [1][2]);
  in_RDI[3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       (double)iVar1 * 8.31451e-07 *
       in_RDI[4].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  iVar1 = SimInfo::getNdf(in_stack_fffffffffffffe90);
  in_RDI[3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
       (double)iVar1 * 8.31451e-07 *
       in_RDI[4].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  local_28 = Thermo::getTotalEnergy(in_stack_fffffffffffffea0);
  dVar3 = in_RDI[5].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1];
  local_30 = (in_RDI[3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
              in_RDI[3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] *
              dVar3 * dVar3) / 0.0008368;
  local_38 = (in_RDI[3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] *
             in_RDI[5].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]) /
             0.0004184;
  this_01 = local_128;
  SquareMatrix3<double>::transpose(this_01);
  OpenMD::operator*(this_01,in_RDI);
  SquareMatrix<double,_3>::SquareMatrix
            ((SquareMatrix<double,_3> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x289ac7);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x289ad1);
  local_50 = SquareMatrix<double,_3>::trace(&local_98);
  local_40 = (in_RDI[3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] *
              in_RDI[3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] *
             local_50) / 0.0008368;
  this_00 = (Thermo *)
            in_RDI[4].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0];
  RVar2 = Thermo::getVolume(this_00);
  local_48 = (((double)this_00 * RVar2) / 163882576.0) / 0.0004184;
  dVar3 = local_28 + local_30 + local_38 + local_40 + local_48;
  local_20 = dVar3;
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x289bd4);
  return dVar3;
}

Assistant:

RealType NPTxyz::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType totalEnergy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;
    RealType barostat_kinetic;
    RealType barostat_potential;
    RealType trEta;

    totalEnergy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tt2 * thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    trEta                         = tmp.trace();

    barostat_kinetic = NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = totalEnergy + thermostat_kinetic +
                        thermostat_potential + barostat_kinetic +
                        barostat_potential;

    return conservedQuantity;
  }